

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reductors.cpp
# Opt level: O0

void opengv::absolute_pose::modules::gpnp4::groebnerRow18_0000_f
               (Matrix<double,_25,_37,_0,_25,_37> *groebnerMatrix,int targetRow)

{
  Scalar SVar1;
  Scalar *pSVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double factor;
  Index in_stack_ffffffffffffff78;
  DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1> *in_stack_ffffffffffffff80;
  DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1> *this;
  
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,0x928b4a);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1> *)*pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff78,0x928b6b);
  dVar3 = (double)this / *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff78,0x928b92);
  *pSVar2 = 0.0;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff78,0x928bbd);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff78,0x928bde);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = SVar1;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *pSVar2;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar4,auVar10,auVar16);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff78,0x928c31);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff78,0x928c52);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = SVar1;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *pSVar2;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar5,auVar11,auVar17);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff78,0x928ca5);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff78,0x928cc6);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = SVar1;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *pSVar2;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar6,auVar12,auVar18);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff78,0x928d19);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff78,0x928d3a);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = SVar1;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *pSVar2;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar7,auVar13,auVar19);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff78,0x928d8d);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff78,0x928dae);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = SVar1;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *pSVar2;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar8,auVar14,auVar20);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff78,0x928e01);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff78,0x928e22);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = SVar1;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *pSVar2;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar9,auVar15,auVar21);
  *pSVar2 = auVar4._0_8_;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp4::groebnerRow18_0000_f( Eigen::Matrix<double,25,37> & groebnerMatrix, int targetRow )
{
  double factor = groebnerMatrix(targetRow,30) / groebnerMatrix(18,30);
  groebnerMatrix(targetRow,30) = 0.0;
  groebnerMatrix(targetRow,31) -= factor * groebnerMatrix(18,31);
  groebnerMatrix(targetRow,32) -= factor * groebnerMatrix(18,32);
  groebnerMatrix(targetRow,33) -= factor * groebnerMatrix(18,33);
  groebnerMatrix(targetRow,34) -= factor * groebnerMatrix(18,34);
  groebnerMatrix(targetRow,35) -= factor * groebnerMatrix(18,35);
  groebnerMatrix(targetRow,36) -= factor * groebnerMatrix(18,36);
}